

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  thread this;
  FOCC_CTA *this_00;
  time_t tVar2;
  istream *piVar3;
  ostream *poVar4;
  FOCC_OTA *pFVar5;
  long lVar6;
  id this_01;
  BOCC_CTA *this_02;
  long *plVar7;
  void *__s;
  int i;
  int iVar8;
  ulong uVar9;
  int i_2;
  int i_1;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  thread tStack_270;
  thread tStack_268;
  long local_260;
  ifstream inFile;
  byte abStack_240 [488];
  undefined1 *local_58;
  thread local_50;
  int local_44;
  thread local_40;
  FOCC_CTA *foccCta;
  BOCC_CTA *boccCta;
  
  tStack_270._M_id._M_thread = (id)0x102517;
  tVar2 = time((time_t *)0x0);
  tStack_270._M_id._M_thread = (id)0x10251e;
  srand((uint)tVar2);
  tStack_270._M_id._M_thread = (id)0x102537;
  std::ifstream::ifstream(&local_260,"inp-params.txt",_S_in);
  if ((abStack_240[*(long *)(local_260 + -0x18)] & 5) == 0) {
    tStack_270._M_id._M_thread = (id)0x10255f;
    piVar3 = (istream *)std::istream::operator>>((istream *)&local_260,(int *)&glb::N);
    tStack_270._M_id._M_thread = (id)0x10256e;
    piVar3 = (istream *)std::istream::operator>>(piVar3,&glb::M);
    tStack_270._M_id._M_thread = (id)0x10257d;
    piVar3 = (istream *)std::istream::operator>>(piVar3,&glb::numTrans);
    tStack_270._M_id._M_thread = (id)0x10258c;
    piVar3 = (istream *)std::istream::operator>>(piVar3,&glb::constVal);
    tStack_270._M_id._M_thread = (id)0x10259b;
    std::istream::operator>>(piVar3,&glb::lambda);
    for (iVar8 = 0; iVar8 < (int)glb::N; iVar8 = iVar8 + 1) {
      local_40._M_id._M_thread = (id)0;
      tStack_270._M_id._M_thread = (id)0x1025c9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                 (unsigned_long *)&local_40);
      local_40._M_id._M_thread = (id)0;
      tStack_270._M_id._M_thread = (id)0x1025d9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                 (unsigned_long *)&local_40);
    }
    tStack_270._M_id._M_thread = (id)0x1025f1;
    poVar4 = std::operator<<((ostream *)&std::cout,"Input Params: N=");
    tStack_270._M_id._M_thread = (id)0x1025ff;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,glb::N);
    tStack_270._M_id._M_thread = (id)0x10260e;
    poVar4 = std::operator<<(poVar4," M = ");
    tStack_270._M_id._M_thread = (id)0x10261c;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,glb::M);
    tStack_270._M_id._M_thread = (id)0x10262b;
    poVar4 = std::operator<<(poVar4," numTrans = ");
    tStack_270._M_id._M_thread = (id)0x102639;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,glb::numTrans);
    tStack_270._M_id._M_thread = (id)0x102648;
    std::operator<<(poVar4,"\n");
    glb::dist = (double)glb::lambda;
    tStack_270._M_id._M_thread = (id)0x10266b;
    std::operator<<((ostream *)&std::cout,"***** FOCC OTA ******\n");
    tStack_270._M_id._M_thread = (id)0x102675;
    pFVar5 = (FOCC_OTA *)operator_new(0x90);
    tStack_270._M_id._M_thread = (id)0x102686;
    FOCC_OTA::FOCC_OTA(pFVar5,glb::M);
    uVar9 = (ulong)glb::N;
    lVar1 = -(uVar9 * 8 + 0xf & 0xfffffffffffffff0);
    __s = (void *)((long)&tStack_268 + lVar1);
    glb::foccOta = pFVar5;
    local_58 = (undefined1 *)&tStack_268;
    if (uVar9 != 0) {
      local_58 = (undefined1 *)&tStack_268;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1026c4;
      memset(__s,0,uVar9 * 8);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1026d7;
    glb::log_file = fopen("FOCC-OTA-log.txt","w");
    iVar8 = 0;
    while( true ) {
      foccCta = (FOCC_CTA *)CONCAT44(foccCta._4_4_,iVar8);
      if ((int)glb::N <= iVar8) break;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102711;
      std::thread::thread<void(&)(FOCC_OTA*,int),FOCC_OTA*&,int&,void>
                (&local_40,updtMem,&glb::foccOta,(int *)&foccCta);
      lVar6 = (long)(int)foccCta;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102721;
      std::thread::operator=((thread *)((long)__s + lVar6 * 8),&local_40);
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102729;
      std::thread::~thread(&local_40);
      iVar8 = (int)foccCta + 1;
    }
    for (lVar6 = 0; pFVar5 = glb::foccOta, lVar6 < (int)glb::N; lVar6 = lVar6 + 1) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102745;
      std::thread::join();
    }
    if (glb::foccOta != (FOCC_OTA *)0x0) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102768;
      FOCC_OTA::~FOCC_OTA(glb::foccOta);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102775;
    operator_delete(pFVar5,0x90);
    lVar6 = 0;
    for (plVar7 = glb::total_delay; plVar7 != DAT_0010b208; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1027a7;
    std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1027e5;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1027ed;
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = 0;
    for (plVar7 = glb::total_aborts; plVar7 != DAT_0010b1f0; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x10281f;
    std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x10285d;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102865;
    std::endl<char,std::char_traits<char>>(poVar4);
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102871;
    fclose(glb::log_file);
    for (iVar8 = 0; iVar8 < (int)glb::N; iVar8 = iVar8 + 1) {
      local_40._M_id._M_thread = (id)0;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x10289c;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                 (unsigned_long *)&local_40);
      local_40._M_id._M_thread = (id)0;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1028ac;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                 (unsigned_long *)&local_40);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1028c4;
    std::operator<<((ostream *)&std::cout,"\n***** FOCC CTA ******\n");
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1028ce;
    this_01._M_thread = (native_handle_type)operator_new(0x90);
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1028df;
    FOCC_CTA::FOCC_CTA((FOCC_CTA *)this_01._M_thread,glb::M);
    local_40._M_id._M_thread = (id)(id)this_01._M_thread;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1028f9;
    glb::log_file = fopen("FOCC-CTA-log.txt","w");
    local_50._M_id._M_thread._0_4_ = 0;
    while( true ) {
      if ((int)glb::N <= (int)local_50._M_id._M_thread) break;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102930;
      std::thread::thread<void(&)(FOCC_CTA*,int),FOCC_CTA*&,int&,void>
                ((thread *)&foccCta,updtMem2,(FOCC_CTA **)&local_40,(int *)&local_50);
      lVar6 = (long)(int)local_50._M_id._M_thread;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102940;
      std::thread::operator=((thread *)((long)__s + lVar6 * 8),(thread *)&foccCta);
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102948;
      std::thread::~thread((thread *)&foccCta);
      local_50._M_id._M_thread._0_4_ = (int)local_50._M_id._M_thread + 1;
    }
    for (lVar6 = 0; this._M_id._M_thread = local_40._M_id._M_thread, lVar6 < (int)glb::N;
        lVar6 = lVar6 + 1) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102964;
      std::thread::join();
    }
    if (local_40._M_id._M_thread != 0) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102984;
      FOCC_CTA::~FOCC_CTA((FOCC_CTA *)this._M_id._M_thread);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102991;
    operator_delete((void *)this._M_id._M_thread,0x90);
    lVar6 = 0;
    for (plVar7 = glb::total_delay; plVar7 != DAT_0010b208; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x1029c3;
    std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar12._0_8_ = lVar6;
    auVar12._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102a01;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102a09;
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = 0;
    for (plVar7 = glb::total_aborts; plVar7 != DAT_0010b1f0; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102a3b;
    std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102a79;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102a81;
    std::endl<char,std::char_traits<char>>(poVar4);
    for (iVar8 = 0; iVar8 < (int)glb::N; iVar8 = iVar8 + 1) {
      foccCta = (FOCC_CTA *)0x0;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102aac;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                 (unsigned_long *)&foccCta);
      foccCta = (FOCC_CTA *)0x0;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102abc;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                 (unsigned_long *)&foccCta);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102ad4;
    std::operator<<((ostream *)&std::cout,"\n***** BOCC CTA ******\n");
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102ade;
    this_02 = (BOCC_CTA *)operator_new(0x98);
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102aef;
    BOCC_CTA::BOCC_CTA(this_02,glb::M);
    foccCta = (FOCC_CTA *)this_02;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b09;
    glb::log_file = fopen("BOCC-CTA-log.txt","w");
    local_44 = 0;
    while( true ) {
      if ((int)glb::N <= local_44) break;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b40;
      std::thread::thread<void(&)(BOCC_CTA*,int),BOCC_CTA*&,int&,void>
                (&local_50,updtMem3,(BOCC_CTA **)&foccCta,&local_44);
      lVar6 = (long)local_44;
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b50;
      std::thread::operator=((thread *)((long)__s + lVar6 * 8),&local_50);
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b58;
      std::thread::~thread(&local_50);
      local_44 = local_44 + 1;
    }
    for (lVar6 = 0; this_00 = foccCta, lVar6 < (int)glb::N; lVar6 = lVar6 + 1) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b74;
      std::thread::join();
    }
    if (foccCta != (FOCC_CTA *)0x0) {
      *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102b94;
      BOCC_CTA::~BOCC_CTA((BOCC_CTA *)this_00);
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102ba1;
    operator_delete(this_00,0x98);
    lVar6 = 0;
    for (plVar7 = glb::total_delay; plVar7 != DAT_0010b208; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102bd3;
    std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar14._0_8_ = lVar6;
    auVar14._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102c11;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102c19;
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = 0;
    for (plVar7 = glb::total_aborts; plVar7 != DAT_0010b1f0; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 + *plVar7;
    }
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102c4b;
    std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar15._0_8_ = lVar6;
    auVar15._12_4_ = 0x45300000;
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102c89;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                        (double)(int)(glb::numTrans * glb::N));
    *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102c91;
    std::endl<char,std::char_traits<char>>(poVar4);
    if (uVar9 != 0) {
      lVar6 = uVar9 << 3;
      do {
        *(undefined8 *)((long)&tStack_270 + lVar1) = 0x102ca7;
        std::thread::~thread((thread *)((long)&tStack_270 + lVar6 + lVar1));
        lVar6 = lVar6 + -8;
      } while (lVar6 != 0);
    }
    *(undefined8 *)(local_58 + -8) = 0x102cbd;
    std::ifstream::~ifstream(&local_260);
    return 0;
  }
  tStack_270._M_id._M_thread = (id)0x102ce1;
  std::operator<<((ostream *)&std::cerr,"inp-params.txt NOT FOUND!\n");
  tStack_270._M_id._M_thread = (id)&LAB_00102ce9;
  exit(1);
}

Assistant:

int main() {
    srand(time(nullptr));

    std::ifstream inFile{"inp-params.txt", std::ifstream::in};
    if(inFile.fail()){
        std::cerr<<"inp-params.txt NOT FOUND!\n";
        exit(1);
    }
    inFile>>glb::N>>glb::M>>glb::numTrans>>glb::constVal>>glb::lambda;

    // initialization.
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"Input Params: N="<<glb::N<<" M = "<<glb::M<<" numTrans = "<<glb::numTrans<<"\n";

    glb::dist = std::exponential_distribution<double>(glb::lambda);

    // -- FOCC OTA ----
    std::cout<<"***** FOCC OTA ******\n";
    glb::foccOta = new FOCC_OTA(glb::M);

    std::thread tids[glb::N];

    glb::log_file = fopen("FOCC-OTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem, glb::foccOta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();
    delete glb::foccOta;

    uint64_t res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    fclose(glb::log_file);


    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** FOCC CTA ******\n";

    FOCC_CTA * foccCta = new FOCC_CTA(glb::M);


    glb::log_file = fopen("FOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem2, foccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete foccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** BOCC CTA ******\n";

    BOCC_CTA * boccCta = new BOCC_CTA(glb::M);


    glb::log_file = fopen("BOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem3, boccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete boccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    return 0;
}